

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::BarrierCase::init(BarrierCase *this,EVP_PKEY_CTX *ctx)

{
  deInt32 *pdVar1;
  size_type *psVar2;
  pointer pbVar3;
  Context *pCVar4;
  RenderContext *renderCtx;
  SharedPtrStateBase *pSVar5;
  RenderTarget *pRVar6;
  long *plVar7;
  ShaderProgram *this_00;
  SharedPtrStateBase *pSVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  TestError *this_01;
  undefined1 usePointMode;
  size_type *psVar10;
  size_type *psVar11;
  size_type *psVar12;
  pointer pbVar13;
  ContextInfo *pCVar14;
  Context *code;
  TessPrimitiveType extraout_EDX;
  TessPrimitiveType extraout_EDX_00;
  TessPrimitiveType extraout_EDX_01;
  TessPrimitiveType extraout_EDX_02;
  TessPrimitiveType primType;
  long extraout_RDX;
  deInt32 *pdVar15;
  long lVar16;
  string fragmentShaderTemplate;
  string numVertsStr;
  string tessellationEvaluationTemplate;
  string tessellationControlTemplate;
  string vertexShaderTemplate;
  size_type *local_368;
  value_type local_360;
  size_type *local_340;
  value_type local_338;
  size_type *local_318;
  value_type local_310;
  undefined1 local_2f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  undefined1 local_2c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  Context *local_288;
  long local_280;
  Context local_278;
  long local_260;
  undefined1 local_258 [16];
  ContextInfo *local_248;
  undefined1 local_238 [24];
  pointer local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  string local_208;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [24];
  pointer pbStack_190;
  ios_base local_138 [32];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_118;
  undefined1 local_f8 [200];
  
  checkTessellationSupport((this->super_TestCase).m_context);
  pRVar6 = Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize
            ((Functional *)(ulong)(uint)pRVar6->m_width,
             (RenderTarget *)(ulong)(uint)pRVar6->m_height,0x100);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<((ostringstream *)local_1a8,0x20);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  local_248 = (ContextInfo *)local_238;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_248,
             "${GLSL_VERSION_DECL}\n\nin highp float in_v_attr;\n\nout highp float in_tc_attr;\n\nvoid main (void)\n{\n\tin_tc_attr = in_v_attr;\n}\n"
             ,"");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0,
                 "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices = ",
                 &local_2a8);
  plVar7 = (long *)std::__cxx11::string::append(local_2f0);
  psVar2 = &local_360._M_string_length;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar10) {
    local_360._M_string_length = *psVar10;
    local_360.field_2._M_allocated_capacity = plVar7[3];
    local_368 = psVar2;
  }
  else {
    local_360._M_string_length = *psVar10;
    local_368 = (size_type *)*plVar7;
  }
  local_360._M_dataplus._M_p = (pointer)plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_368,(ulong)local_2a8._M_dataplus._M_p);
  psVar10 = &local_338._M_string_length;
  psVar11 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar11) {
    local_338._M_string_length = *psVar11;
    local_338.field_2._M_allocated_capacity = plVar7[3];
    local_340 = psVar10;
  }
  else {
    local_338._M_string_length = *psVar11;
    local_340 = (size_type *)*plVar7;
  }
  local_338._M_dataplus._M_p = (pointer)plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_340);
  psVar11 = &local_310._M_string_length;
  psVar12 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar12) {
    local_310._M_string_length = *psVar12;
    local_310.field_2._M_allocated_capacity = plVar7[3];
    local_318 = psVar11;
  }
  else {
    local_310._M_string_length = *psVar12;
    local_318 = (size_type *)*plVar7;
  }
  local_310._M_dataplus._M_p = (pointer)plVar7[1];
  *plVar7 = (long)psVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_318,(ulong)local_2a8._M_dataplus._M_p);
  pbVar3 = (pointer)(local_1a8 + 0x10);
  pbVar13 = (pointer)(plVar7 + 2);
  if ((pointer)*plVar7 == pbVar13) {
    local_1a8._16_8_ = (pbVar13->_M_dataplus)._M_p;
    pbStack_190 = (pointer)plVar7[3];
    local_1a8._0_8_ = pbVar3;
  }
  else {
    local_1a8._16_8_ = (pbVar13->_M_dataplus)._M_p;
    local_1a8._0_8_ = (pointer)*plVar7;
  }
  local_1a8._8_8_ = plVar7[1];
  *plVar7 = (long)pbVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append(local_1a8);
  local_278.m_contextInfo = (ContextInfo *)local_258;
  pCVar14 = (ContextInfo *)(plVar7 + 2);
  if ((ContextInfo *)*plVar7 == pCVar14) {
    local_258._0_8_ = pCVar14->_vptr_ContextInfo;
    local_258._8_8_ = plVar7[3];
  }
  else {
    local_258._0_8_ = pCVar14->_vptr_ContextInfo;
    local_278.m_contextInfo = (ContextInfo *)*plVar7;
  }
  lVar16 = plVar7[1];
  *plVar7 = (long)pCVar14;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_260 = lVar16;
  if ((pointer)local_1a8._0_8_ != pbVar3) {
    operator_delete((void *)local_1a8._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_1a8._16_8_)->_M_p + 1));
    lVar16 = extraout_RDX;
  }
  usePointMode = SUB81(pCVar14,0);
  primType = (TessPrimitiveType)lVar16;
  if (local_318 != psVar11) {
    operator_delete(local_318,local_310._M_string_length + 1);
    primType = extraout_EDX;
  }
  if (local_340 != psVar10) {
    operator_delete(local_340,local_338._M_string_length + 1);
    primType = extraout_EDX_00;
  }
  if (local_368 != psVar2) {
    operator_delete(local_368,local_360._M_string_length + 1);
    primType = extraout_EDX_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._0_8_ != &local_2e0) {
    operator_delete((void *)local_2f0._0_8_,local_2e0._M_allocated_capacity + 1);
    primType = extraout_EDX_02;
  }
  Functional::(anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
            ((string *)local_2c8,(_anonymous_namespace_ *)&DAT_00000001,primType,(bool)usePointMode)
  ;
  plVar7 = (long *)std::__cxx11::string::replace((ulong)local_2c8,0,(char *)0x0,0x1c3bf3f);
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 == paVar9) {
    local_2e0._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_2e0._8_8_ = plVar7[3];
    local_2f0._0_8_ = &local_2e0;
  }
  else {
    local_2e0._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_2f0._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar7;
  }
  local_2f0._8_8_ = plVar7[1];
  *plVar7 = (long)paVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append(local_2f0);
  psVar12 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar12) {
    local_360._M_string_length = *psVar12;
    local_360.field_2._M_allocated_capacity = plVar7[3];
    local_368 = psVar2;
  }
  else {
    local_360._M_string_length = *psVar12;
    local_368 = (size_type *)*plVar7;
  }
  local_360._M_dataplus._M_p = (pointer)plVar7[1];
  *plVar7 = (long)psVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_368,(ulong)local_2a8._M_dataplus._M_p);
  psVar12 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar12) {
    local_338._M_string_length = *psVar12;
    local_338.field_2._M_allocated_capacity = plVar7[3];
    local_340 = psVar10;
  }
  else {
    local_338._M_string_length = *psVar12;
    local_340 = (size_type *)*plVar7;
  }
  local_338._M_dataplus._M_p = (pointer)plVar7[1];
  *plVar7 = (long)psVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_340);
  psVar12 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar12) {
    local_310._M_string_length = *psVar12;
    local_310.field_2._M_allocated_capacity = plVar7[3];
    local_318 = psVar11;
  }
  else {
    local_310._M_string_length = *psVar12;
    local_318 = (size_type *)*plVar7;
  }
  local_310._M_dataplus._M_p = (pointer)plVar7[1];
  *plVar7 = (long)psVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_318,(ulong)local_2a8._M_dataplus._M_p);
  pbVar13 = (pointer)(plVar7 + 2);
  if ((pointer)*plVar7 == pbVar13) {
    local_1a8._16_8_ = (pbVar13->_M_dataplus)._M_p;
    pbStack_190 = (pointer)plVar7[3];
    local_1a8._0_8_ = pbVar3;
  }
  else {
    local_1a8._16_8_ = (pbVar13->_M_dataplus)._M_p;
    local_1a8._0_8_ = (pointer)*plVar7;
  }
  local_1a8._8_8_ = plVar7[1];
  *plVar7 = (long)pbVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append(local_1a8);
  local_288 = &local_278;
  code = (Context *)(plVar7 + 2);
  if ((Context *)*plVar7 == code) {
    local_278.m_testCtx = code->m_testCtx;
    local_278.m_renderCtx = (RenderContext *)plVar7[3];
  }
  else {
    local_278.m_testCtx = code->m_testCtx;
    local_288 = (Context *)*plVar7;
  }
  local_280 = plVar7[1];
  *plVar7 = (long)code;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((pointer)local_1a8._0_8_ != pbVar3) {
    operator_delete((void *)local_1a8._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_1a8._16_8_)->_M_p + 1));
  }
  if (local_318 != psVar11) {
    operator_delete(local_318,local_310._M_string_length + 1);
  }
  if (local_340 != psVar10) {
    operator_delete(local_340,local_338._M_string_length + 1);
  }
  if (local_368 != psVar2) {
    operator_delete(local_368,local_360._M_string_length + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._0_8_ != &local_2e0) {
    operator_delete((void *)local_2f0._0_8_,local_2e0._M_allocated_capacity + 1);
  }
  if ((Context *)local_2c8._0_8_ != (Context *)(local_2c8 + 0x10)) {
    operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
  }
  local_2c8._0_8_ = (Context *)(local_2c8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2c8,
             "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nin highp float in_f_blue;\n\nvoid main (void)\n{\n\to_color = vec4(1.0, 0.0, in_f_blue, 1.0);\n}\n"
             ,"");
  this_00 = (ShaderProgram *)operator_new(0xd0);
  pCVar4 = (this->super_TestCase).m_context;
  renderCtx = pCVar4->m_renderCtx;
  memset(local_1a8,0,0xac);
  local_f8._0_8_ = (pointer)0x0;
  local_f8[8] = 0;
  local_f8._9_7_ = 0;
  local_f8[0x10] = 0;
  local_f8._17_8_ = 0;
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)(local_238 + 0x10),(_anonymous_namespace_ *)pCVar4->m_renderCtx,
             (Context *)local_248,(char *)code);
  local_318 = (size_type *)((ulong)local_318 & 0xffffffff00000000);
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_310,local_238._16_8_,
             (char *)(local_238._16_8_ + (long)&local_220->_M_dataplus));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1a8 + ((ulong)local_318 & 0xffffffff) * 0x18),&local_310);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_1c8,(_anonymous_namespace_ *)((this->super_TestCase).m_context)->m_renderCtx,
             (Context *)local_278.m_contextInfo,(char *)code);
  local_340 = (size_type *)CONCAT44(local_340._4_4_,3);
  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_338,local_1c8._M_dataplus._M_p,
             local_1c8._M_dataplus._M_p + local_1c8._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1a8 + ((ulong)local_340 & 0xffffffff) * 0x18),&local_338);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_1e8,(_anonymous_namespace_ *)((this->super_TestCase).m_context)->m_renderCtx,
             local_288,(char *)code);
  local_368 = (size_type *)CONCAT44(local_368._4_4_,4);
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_360,local_1e8._M_dataplus._M_p,
             local_1e8._M_dataplus._M_p + local_1e8._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1a8 + ((ulong)local_368 & 0xffffffff) * 0x18),&local_360);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_208,(_anonymous_namespace_ *)((this->super_TestCase).m_context)->m_renderCtx,
             (Context *)local_2c8._0_8_,(char *)code);
  local_2f0._0_4_ = 1;
  local_2f0._8_8_ = local_2e0._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_2f0 + 8),local_208._M_dataplus._M_p,
             local_208._M_dataplus._M_p + local_208._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1a8 + (local_2f0._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_2f0 + 8));
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,(ProgramSources *)local_1a8);
  pSVar8 = (SharedPtrStateBase *)operator_new(0x20);
  pdVar1 = &pSVar8->strongRefCount;
  pSVar8->strongRefCount = 0;
  pSVar8->weakRefCount = 0;
  pSVar8->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0212cb98;
  pSVar8[1]._vptr_SharedPtrStateBase = (_func_int **)this_00;
  pSVar8->strongRefCount = 1;
  pSVar8->weakRefCount = 1;
  pSVar5 = (this->m_program).m_state;
  if (pSVar5 != pSVar8) {
    if (pSVar5 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar15 = &pSVar5->strongRefCount;
      *pdVar15 = *pdVar15 + -1;
      UNLOCK();
      if (*pdVar15 == 0) {
        (this->m_program).m_ptr = (ShaderProgram *)0x0;
        (*((this->m_program).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar15 = &((this->m_program).m_state)->weakRefCount;
      *pdVar15 = *pdVar15 + -1;
      UNLOCK();
      if (*pdVar15 == 0) {
        pSVar5 = (this->m_program).m_state;
        if (pSVar5 != (SharedPtrStateBase *)0x0) {
          (*pSVar5->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_program).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_program).m_ptr = this_00;
    (this->m_program).m_state = pSVar8;
    LOCK();
    pSVar8->strongRefCount = pSVar8->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar15 = &((this->m_program).m_state)->weakRefCount;
    *pdVar15 = *pdVar15 + 1;
    UNLOCK();
  }
  pdVar15 = &pSVar8->weakRefCount;
  LOCK();
  *pdVar1 = *pdVar1 + -1;
  UNLOCK();
  if (*pdVar1 == 0) {
    (*pSVar8->_vptr_SharedPtrStateBase[2])(pSVar8);
  }
  LOCK();
  *pdVar15 = *pdVar15 + -1;
  UNLOCK();
  if (*pdVar15 == 0) {
    (*pSVar8->_vptr_SharedPtrStateBase[1])(pSVar8);
  }
  if ((char *)local_2f0._8_8_ != local_2e0._M_local_buf + 8) {
    operator_delete((void *)local_2f0._8_8_,local_2e0._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._16_8_ != &local_218) {
    operator_delete((void *)local_238._16_8_,local_218._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_f8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_118);
  lVar16 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1a8 + lVar16));
    lVar16 = lVar16 + -0x18;
  } while (lVar16 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (this->m_program).m_ptr);
  if ((((this->m_program).m_ptr)->m_program).m_info.linkOk != false) {
    if ((Context *)local_2c8._0_8_ != (Context *)(local_2c8 + 0x10)) {
      operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
    }
    if (local_288 != &local_278) {
      operator_delete(local_288,(ulong)((long)&(local_278.m_testCtx)->m_platform + 1));
    }
    if (local_278.m_contextInfo != (ContextInfo *)local_258) {
      operator_delete(local_278.m_contextInfo,(ulong)((long)(Platform **)local_258._0_8_ + 1));
    }
    if (local_248 != (ContextInfo *)local_238) {
      operator_delete(local_248,(ulong)((long)(Platform **)local_238._0_8_ + 1));
    }
    paVar9 = &local_2a8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != paVar9) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      paVar9 = extraout_RAX;
    }
    return (int)paVar9;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Program compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
             ,0xd7b);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void BarrierCase::init (void)
{
	checkTessellationSupport(m_context);
	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	const string numVertsStr = de::toString(NUM_VERTICES);

	std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "in highp float in_v_attr;\n"
													 "\n"
													 "out highp float in_tc_attr;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	in_tc_attr = in_v_attr;\n"
												 "}\n");
	std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
													 "\n"
													 "layout (vertices = " + numVertsStr + ") out;\n"
													 "\n"
													 "in highp float in_tc_attr[];\n"
													 "\n"
													 "out highp float in_te_attr[];\n"
													 "patch out highp float in_te_patchAttr;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	in_te_attr[gl_InvocationID] = in_tc_attr[gl_InvocationID];\n"
													 "	in_te_patchAttr = 0.0f;\n"
													 "	barrier();\n"
													 "	if (gl_InvocationID == 5)\n"
													 "		in_te_patchAttr = float(gl_InvocationID)*0.1;\n"
													 "	barrier();\n"
													 "	highp float temp = in_te_patchAttr + in_te_attr[gl_InvocationID];\n"
													 "	barrier();\n"
													 "	if (gl_InvocationID == " + numVertsStr + "-1)\n"
													 "		in_te_patchAttr = float(gl_InvocationID);\n"
													 "	barrier();\n"
													 "	in_te_attr[gl_InvocationID] = temp;\n"
													 "	barrier();\n"
													 "	temp = temp + in_te_attr[(gl_InvocationID+1) % " + numVertsStr + "];\n"
													 "	barrier();\n"
													 "	in_te_attr[gl_InvocationID] = 0.25*temp;\n"
													 "\n"
													 "	gl_TessLevelInner[0] = 32.0;\n"
													 "	gl_TessLevelInner[1] = 32.0;\n"
													 "\n"
													 "	gl_TessLevelOuter[0] = 32.0;\n"
													 "	gl_TessLevelOuter[1] = 32.0;\n"
													 "	gl_TessLevelOuter[2] = 32.0;\n"
													 "	gl_TessLevelOuter[3] = 32.0;\n"
												 "}\n");
	std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
													 "\n"
													 + getTessellationEvaluationInLayoutString(TESSPRIMITIVETYPE_QUADS) +
													 "\n"
													 "in highp float in_te_attr[];\n"
													 "patch in highp float in_te_patchAttr;\n"
													 "\n"
													 "out highp float in_f_blue;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	highp float x = gl_TessCoord.x*2.0 - 1.0;\n"
													 "	highp float y = gl_TessCoord.y - in_te_attr[int(round(gl_TessCoord.x*float(" + numVertsStr + "-1)))];\n"
													 "	gl_Position = vec4(x, y, 0.0, 1.0);\n"
													 "	in_f_blue = abs(in_te_patchAttr - float(" + numVertsStr + "-1));\n"
												 "}\n");
	std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "layout (location = 0) out mediump vec4 o_color;\n"
													 "\n"
													 "in highp float in_f_blue;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	o_color = vec4(1.0, 0.0, in_f_blue, 1.0);\n"
												 "}\n");

	m_program = SharedPtr<const ShaderProgram>(new ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
			<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
			<< glu::TessellationControlSource		(specializeShader(m_context, tessellationControlTemplate.c_str()))
			<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
			<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()))));

	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		TCU_FAIL("Program compilation failed");
}